

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O3

void __thiscall ObjectBlockPool<128,_512>::~ObjectBlockPool(ObjectBlockPool<128,_512> *this)

{
  Reset(this);
  if ((this->objectsToFree).data != (SmallBlock<128> **)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  if ((this->objectsToFinalize).data != (SmallBlock<128> **)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  if ((this->sortedPages).data != (LargeBlock<128,_512> **)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  return;
}

Assistant:

~ObjectBlockPool()
	{
		Reset();
	}